

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_modelUnitsAttributeBeforeNameAttribute_Test::
~Variable_modelUnitsAttributeBeforeNameAttribute_Test
          (Variable_modelUnitsAttributeBeforeNameAttribute_Test *this)

{
  Variable_modelUnitsAttributeBeforeNameAttribute_Test *this_local;
  
  ~Variable_modelUnitsAttributeBeforeNameAttribute_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, modelUnitsAttributeBeforeNameAttribute)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"model\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"valid_name\">\n"
        "    <variable units=\"dimensionless\" name=\"variable1\" interface=\"none\"/>\n"
        "    <variable id=\"sin\" units=\"dimensionless\" name=\"sin1\" interface=\"public_and_private\"/>\n"
        "    <variable id=\"deriv_approx_initial_value\" units=\"dimensionless\" initial_value=\"0\" name=\"deriv_approx_initial_value\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(e);
    EXPECT_EQ(size_t(0), parser->issueCount());
}